

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.cpp
# Opt level: O2

bool slang::syntax::RsProdSyntax::isKind(SyntaxKind kind)

{
  return (bool)(0x3bU >> ((byte)(kind - RsCase) & 0x1f) & kind - RsCase < 6);
}

Assistant:

bool RsProdSyntax::isKind(SyntaxKind kind) {
    switch (kind) {
        case SyntaxKind::RsCase:
        case SyntaxKind::RsCodeBlock:
        case SyntaxKind::RsIfElse:
        case SyntaxKind::RsProdItem:
        case SyntaxKind::RsRepeat:
            return true;
        default:
            return false;
    }
}